

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

void gpioStopThread(pthread_t *pth)

{
  FILE *pFVar1;
  pthread_t pVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: pth=%08lX\n",myTimeStamp::buf,"gpioStopThread",pth);
  }
  pFVar1 = _stderr;
  if ((libInitialised == '\0') && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "gpioStopThread");
  }
  if (pth != (pthread_t *)0x0) {
    pVar2 = pthread_self();
    if (pVar2 != *pth) {
      pthread_cancel(*pth);
      pthread_join(*pth,(void **)0x0);
      free(pth);
      return;
    }
    free(pth);
    pthread_exit((void *)0x0);
  }
  return;
}

Assistant:

void gpioStopThread(pthread_t *pth)
{
   DBG(DBG_USER, "pth=%08"PRIXPTR, (uintptr_t)pth);

   CHECK_INITED_RET_NIL;

   if (pth)
   {
      if (pthread_self() == *pth)
      {
         free(pth);
         pthread_exit(NULL);
      }
      else
      {
         pthread_cancel(*pth);
         pthread_join(*pth, NULL);
         free(pth);
      }
   }
}